

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bign_params.c
# Opt level: O1

size_t bignParamsGen_deep(size_t n)

{
  size_t sVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  
  sVar1 = beltHash_keep();
  sVar2 = beltHash_keep();
  sVar3 = priIsPrime_deep(n);
  sVar4 = ecpDetIsZero_deep(n);
  sVar5 = ecpMOVIsMet_deep(n);
  sVar6 = zzPowerMod_deep(n,n);
  sVar2 = utilMax(5,sVar2,sVar3,sVar4,sVar5,sVar6);
  return sVar2 + sVar1 + n * 0x20 + 8;
}

Assistant:

static size_t bignParamsGen_deep(size_t n)
{
	return O_OF_W(4 * n) + 8 + beltHash_keep() + 
		utilMax(5,
			beltHash_keep(),
			priIsPrime_deep(n),
			ecpDetIsZero_deep(n),
			ecpMOVIsMet_deep(n),
			zzPowerMod_deep(n, n)
		);
}